

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_GROUP * EC_KEY_parse_parameters(CBS *cbs)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *bn;
  BIGNUM *pBVar4;
  BIGNUM *b_00;
  pointer pbVar5;
  EC_POINT *p_00;
  EC_GROUP *group;
  size_t i;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_a0;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> p;
  explicit_prime_curve curve;
  CBS *cbs_local;
  
  curve.order.len = (size_t)cbs;
  iVar2 = CBS_peek_asn1_tag(cbs,0x20000010);
  if (iVar2 == 0) {
    cbs_local = (CBS *)EC_KEY_parse_curve_name((CBS *)curve.order.len);
  }
  else {
    iVar2 = parse_explicit_prime_curve((CBS *)curve.order.len,(explicit_prime_curve *)&p);
    if (iVar2 == 0) {
      cbs_local = (CBS *)0x0;
    }
    else {
      pBVar3 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&a,(pointer)pBVar3);
      pBVar3 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&b,(pointer)pBVar3);
      pBVar3 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&x,(pointer)pBVar3);
      pBVar3 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&y,(pointer)pBVar3);
      pBVar3 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_a0,(pointer)pBVar3);
      bVar1 = std::operator==(&a,(nullptr_t)0x0);
      if ((((bVar1) || (bVar1 = std::operator==(&b,(nullptr_t)0x0), bVar1)) ||
          (bVar1 = std::operator==(&x,(nullptr_t)0x0), bVar1)) ||
         ((bVar1 = std::operator==(&y,(nullptr_t)0x0), bVar1 ||
          (bVar1 = std::operator==(&local_a0,(nullptr_t)0x0), bVar1)))) {
        cbs_local = (CBS *)0x0;
      }
      else {
        for (group = (EC_GROUP *)0x0; group < (EC_GROUP *)0x4;
            group = (EC_GROUP *)((long)&group->meth + 1)) {
          cbs_local = (CBS *)(*kAllGroups[(long)group])();
          bn = EC_GROUP_get0_order((EC_GROUP *)cbs_local);
          iVar2 = integers_equal((CBS *)&curve.base_y.len,bn);
          if (iVar2 != 0) {
            pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&a);
            pBVar4 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
            b_00 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&x);
            iVar2 = EC_GROUP_get_curve_GFp((EC_GROUP *)cbs_local,pBVar3,pBVar4,b_00,(BN_CTX *)0x0);
            if (iVar2 == 0) {
              cbs_local = (CBS *)0x0;
              goto LAB_001b7a59;
            }
            pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&a);
            iVar2 = integers_equal((CBS *)&p,pbVar5);
            if (iVar2 != 0) {
              pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
              iVar2 = integers_equal((CBS *)&curve.prime.len,pbVar5);
              if (iVar2 != 0) {
                pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&x);
                iVar2 = integers_equal((CBS *)&curve.a.len,pbVar5);
                if (iVar2 != 0) {
                  p_00 = EC_GROUP_get0_generator((EC_GROUP *)cbs_local);
                  pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&y);
                  pBVar4 = (BIGNUM *)
                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_a0);
                  iVar2 = EC_POINT_get_affine_coordinates_GFp
                                    ((EC_GROUP *)cbs_local,p_00,pBVar3,pBVar4,(BN_CTX *)0x0);
                  if (iVar2 == 0) {
                    cbs_local = (CBS *)0x0;
                    goto LAB_001b7a59;
                  }
                  pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&y);
                  iVar2 = integers_equal((CBS *)&curve.b.len,pbVar5);
                  if (iVar2 != 0) {
                    pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_a0);
                    iVar2 = integers_equal((CBS *)&curve.base_x.len,pbVar5);
                    if (iVar2 != 0) goto LAB_001b7a59;
                  }
                }
              }
            }
            break;
          }
        }
        ERR_put_error(0xf,0,0x7b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                      ,0x179);
        cbs_local = (CBS *)0x0;
      }
LAB_001b7a59:
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_a0);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&y);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&x);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&b);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
    }
  }
  return (EC_GROUP *)cbs_local;
}

Assistant:

EC_GROUP *EC_KEY_parse_parameters(CBS *cbs) {
  if (!CBS_peek_asn1_tag(cbs, CBS_ASN1_SEQUENCE)) {
    return EC_KEY_parse_curve_name(cbs);
  }

  // OpenSSL sometimes produces ECPrivateKeys with explicitly-encoded versions
  // of named curves.
  //
  // TODO(davidben): Remove support for this.
  struct explicit_prime_curve curve;
  if (!parse_explicit_prime_curve(cbs, &curve)) {
    return nullptr;
  }

  bssl::UniquePtr<BIGNUM> p(BN_new());
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> x(BN_new());
  bssl::UniquePtr<BIGNUM> y(BN_new());
  if (p == nullptr || a == nullptr || b == nullptr || x == nullptr ||
      y == nullptr) {
    return nullptr;
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (!integers_equal(&curve.order, EC_GROUP_get0_order(group))) {
      continue;
    }

    // The order alone uniquely identifies the group, but we check the other
    // parameters to avoid misinterpreting the group.
    if (!EC_GROUP_get_curve_GFp(group, p.get(), a.get(), b.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.prime, p.get()) ||
        !integers_equal(&curve.a, a.get()) ||
        !integers_equal(&curve.b, b.get())) {
      break;
    }
    if (!EC_POINT_get_affine_coordinates_GFp(
            group, EC_GROUP_get0_generator(group), x.get(), y.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.base_x, x.get()) ||
        !integers_equal(&curve.base_y, y.get())) {
      break;
    }
    return const_cast<EC_GROUP *>(group);
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return nullptr;
}